

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_TEXLDL(Context *ctx)

{
  char *pcVar1;
  char *fmt;
  
  if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
    if (ctx->profile_supports_nv2 != 0) goto LAB_0011b91e;
    pcVar1 = ctx->profile->name;
    fmt = "Pixel shader TEXLDL unsupported in %s profile";
  }
  else {
    if ((ctx->shader_type != MOJOSHADER_TYPE_VERTEX) || (ctx->profile_supports_nv3 != 0)) {
LAB_0011b91e:
      arb1_texld(ctx,"TXL",0);
      return;
    }
    pcVar1 = ctx->profile->name;
    fmt = "Vertex shader TEXLDL unsupported in %s profile";
  }
  failf(ctx,fmt,pcVar1);
  return;
}

Assistant:

static void emit_ARB1_TEXLDL(Context *ctx)
{
    if ((shader_is_vertex(ctx)) && (!support_nv3(ctx)))
    {
        failf(ctx, "Vertex shader TEXLDL unsupported in %s profile",
              ctx->profile->name);
        return;
    } // if

    else if ((shader_is_pixel(ctx)) && (!support_nv2(ctx)))
    {
        failf(ctx, "Pixel shader TEXLDL unsupported in %s profile",
              ctx->profile->name);
        return;
    } // if

    // !!! FIXME: this doesn't map exactly to TEXLDL. Review this.
    arb1_texld(ctx, "TXL", 0);
}